

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrMan.c
# Opt level: O0

Rwr_Man_t * Rwr_ManStart(int fPrecompute)

{
  abctime aVar1;
  Rwr_Man_t *p_00;
  void *pvVar2;
  char *pcVar3;
  Rwr_Node_t **ppRVar4;
  Extra_MmFixed_t *pEVar5;
  Vec_Ptr_t *pVVar6;
  char **ppcVar7;
  Vec_Int_t *pVVar8;
  abctime aVar9;
  abctime clk;
  Rwr_Man_t *p;
  Dec_Man_t *pManDec;
  int fPrecompute_local;
  
  Abc_Clock();
  aVar1 = Abc_Clock();
  p_00 = (Rwr_Man_t *)malloc(0x470);
  memset(p_00,0,0x470);
  p_00->nFuncs = 0x10000;
  pvVar2 = Abc_FrameReadManDec();
  p_00->puCanons = *(unsigned_short **)((long)pvVar2 + 0x18);
  p_00->pPhases = *(char **)((long)pvVar2 + 0x20);
  p_00->pPerms = *(char **)((long)pvVar2 + 0x28);
  p_00->pMap = *(uchar **)((long)pvVar2 + 0x30);
  pcVar3 = Rwr_ManGetPractical(p_00);
  p_00->pPractical = pcVar3;
  ppRVar4 = (Rwr_Node_t **)malloc((long)p_00->nFuncs << 3);
  p_00->pTable = ppRVar4;
  memset(p_00->pTable,0,(long)p_00->nFuncs << 3);
  pEVar5 = Extra_MmFixedStart(0x30);
  p_00->pMmNode = pEVar5;
  pVVar6 = Vec_PtrAlloc(100);
  p_00->vForest = pVVar6;
  Rwr_ManAddVar(p_00,0,fPrecompute);
  Rwr_ManAddVar(p_00,0xaaaa,fPrecompute);
  Rwr_ManAddVar(p_00,0xcccc,fPrecompute);
  Rwr_ManAddVar(p_00,0xf0f0,fPrecompute);
  Rwr_ManAddVar(p_00,0xff00,fPrecompute);
  p_00->nClasses = 5;
  p_00->nTravIds = 1;
  ppcVar7 = Extra_Permutations(4);
  p_00->pPerms4 = ppcVar7;
  pVVar8 = Vec_IntAlloc(0x32);
  p_00->vLevNums = pVVar8;
  pVVar6 = Vec_PtrAlloc(0x32);
  p_00->vFanins = pVVar6;
  pVVar6 = Vec_PtrAlloc(0x32);
  p_00->vFaninsCur = pVVar6;
  pVVar6 = Vec_PtrAlloc(0x32);
  p_00->vNodesTemp = pVVar6;
  if (fPrecompute == 0) {
    Rwr_ManLoadFromArray(p_00,0);
    Rwr_ManPreprocess(p_00);
  }
  else {
    Rwr_ManPrecompute(p_00);
    Rwr_ManWriteToArray(p_00);
  }
  aVar9 = Abc_Clock();
  p_00->timeStart = aVar9 - aVar1;
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts rewriting manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Rwr_Man_t * Rwr_ManStart( int  fPrecompute )
{
    Dec_Man_t * pManDec;
    Rwr_Man_t * p;
    abctime clk = Abc_Clock();
clk = Abc_Clock();
    p = ABC_ALLOC( Rwr_Man_t, 1 );
    memset( p, 0, sizeof(Rwr_Man_t) );
    p->nFuncs = (1<<16);
    pManDec   = (Dec_Man_t *)Abc_FrameReadManDec();
    p->puCanons = pManDec->puCanons; 
    p->pPhases  = pManDec->pPhases; 
    p->pPerms   = pManDec->pPerms; 
    p->pMap     = pManDec->pMap; 
    // initialize practical NPN classes
    p->pPractical  = Rwr_ManGetPractical( p );
    // create the table
    p->pTable = ABC_ALLOC( Rwr_Node_t *, p->nFuncs );
    memset( p->pTable, 0, sizeof(Rwr_Node_t *) * p->nFuncs );
    // create the elementary nodes
    p->pMmNode  = Extra_MmFixedStart( sizeof(Rwr_Node_t) );
    p->vForest  = Vec_PtrAlloc( 100 );
    Rwr_ManAddVar( p, 0x0000, fPrecompute ); // constant 0
    Rwr_ManAddVar( p, 0xAAAA, fPrecompute ); // var A
    Rwr_ManAddVar( p, 0xCCCC, fPrecompute ); // var B
    Rwr_ManAddVar( p, 0xF0F0, fPrecompute ); // var C
    Rwr_ManAddVar( p, 0xFF00, fPrecompute ); // var D
    p->nClasses = 5;
    // other stuff
    p->nTravIds   = 1;
    p->pPerms4    = Extra_Permutations( 4 );
    p->vLevNums   = Vec_IntAlloc( 50 );
    p->vFanins    = Vec_PtrAlloc( 50 );
    p->vFaninsCur = Vec_PtrAlloc( 50 );
    p->vNodesTemp = Vec_PtrAlloc( 50 );
    if ( fPrecompute )
    {   // precompute subgraphs
        Rwr_ManPrecompute( p );
//        Rwr_ManPrint( p );
        Rwr_ManWriteToArray( p );
    }
    else
    {   // load saved subgraphs
        Rwr_ManLoadFromArray( p, 0 );
//        Rwr_ManPrint( p );
        Rwr_ManPreprocess( p );
    }
p->timeStart = Abc_Clock() - clk;
    return p;
}